

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_1::ComputePipeline::initPrograms(SourceCollections *dst)

{
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [40];
  
  std::__cxx11::string::string<std::allocator<char>>(local_60,"comp",&local_61);
  local_40._0_4_ = VK_SHADER_STAGE_COMPUTE_BIT;
  std::__cxx11::string::string((string *)(local_40 + 8),local_60);
  ShaderModule::initPrograms(dst,(Parameters *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

static void initPrograms (SourceCollections& dst, Parameters)
	{
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_COMPUTE_BIT, "comp"));
	}